

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O2

string * extractFileName(string *__return_storage_ptr__,string *src)

{
  char cVar1;
  size_type sVar2;
  long lVar3;
  size_type sVar4;
  long lVar5;
  size_type sVar6;
  string rez;
  _Alloc_hider local_30;
  size_type local_28;
  char local_20;
  undefined7 uStack_1f;
  undefined8 uStack_18;
  
  sVar2 = src->_M_string_length;
  sVar4 = sVar2;
  sVar6 = sVar2;
  do {
    lVar3 = sVar6 + 1;
    do {
      lVar5 = lVar3;
      if (lVar5 == 1) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"",(allocator<char> *)&local_30);
        return __return_storage_ptr__;
      }
      cVar1 = (src->_M_dataplus)._M_p[lVar5 + -2];
      if ((cVar1 == '\\') || (cVar1 == '/')) {
        std::__cxx11::string::substr((ulong)&local_30,(ulong)src);
        if ((local_28 == 0) || (local_30._M_p[local_28 - 1] != '\"')) {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          if (local_30._M_p == &local_20) {
            (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_1f,local_20);
            *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_18;
          }
          else {
            (__return_storage_ptr__->_M_dataplus)._M_p = local_30._M_p;
            (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_1f,local_20);
          }
          __return_storage_ptr__->_M_string_length = local_28;
          local_28 = 0;
          local_20 = '\0';
          local_30._M_p = &local_20;
        }
        else {
          std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)&local_30);
        }
        std::__cxx11::string::~string((string *)&local_30);
        return __return_storage_ptr__;
      }
      lVar3 = lVar5 + -1;
    } while (cVar1 != '.');
    sVar6 = lVar5 - 2;
    if (sVar4 == sVar2) {
      sVar4 = sVar6;
    }
  } while( true );
}

Assistant:

string extractFileName(const string& src)
{
    size_t endPos = src.size();
    for (size_t i = src.size(); i-- > 0;)
        if (src[i] == '.')
        {
            if (endPos == src.size())
                endPos = i;
        }
        else if (src[i] == '/' || src[i] == '\\')
        {
            string rez = src.substr(i + 1, endPos - i - 1);
            if (!rez.empty() && rez[rez.size() - 1] == '\"')
                return rez.substr(0, rez.size() - 1);
            return rez;
        }
    return "";
}